

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
vkt::geometry::anon_unknown_2::GeometryInputTestInstance::genVertexAttribData
          (GeometryInputTestInstance *this)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  pointer pVVar1;
  int i;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec4 offset;
  float local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [6];
  float local_20 [4];
  
  local_20[0] = -0.5;
  local_20[1] = -0.2;
  local_20[2] = 0.0;
  local_20[3] = 1.0;
  (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices = 0xc;
  this_00 = &(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(this_00,0xc);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1->m_data = local_48;
  *(undefined8 *)(pVVar1->m_data + 2) = uStack_40;
  local_38[0] = -1.0;
  local_38[1] = -1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[1].m_data = local_48;
  *(undefined8 *)(pVVar1[1].m_data + 2) = uStack_40;
  local_38[0] = 0.0;
  local_38[1] = -1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[2].m_data = local_48;
  *(undefined8 *)(pVVar1[2].m_data + 2) = uStack_40;
  local_38[0] = 1.0;
  local_38[1] = 1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[3].m_data = local_48;
  *(undefined8 *)(pVVar1[3].m_data + 2) = uStack_40;
  local_38[0] = 1.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[4].m_data = local_48;
  *(undefined8 *)(pVVar1[4].m_data + 2) = uStack_40;
  local_38[0] = 0.0;
  local_38[1] = -2.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[5].m_data = local_48;
  *(undefined8 *)(pVVar1[5].m_data + 2) = uStack_40;
  local_38[0] = 1.0;
  local_38[1] = -1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[6].m_data = local_48;
  *(undefined8 *)(pVVar1[6].m_data + 2) = uStack_40;
  local_38[0] = 2.0;
  local_38[1] = 1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[7].m_data = local_48;
  *(undefined8 *)(pVVar1[7].m_data + 2) = uStack_40;
  local_38[0] = 2.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[8].m_data = local_48;
  *(undefined8 *)(pVVar1[8].m_data + 2) = uStack_40;
  local_38[0] = 1.0;
  local_38[1] = -2.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[9].m_data = local_48;
  *(undefined8 *)(pVVar1[9].m_data + 2) = uStack_40;
  local_38[0] = 2.0;
  local_38[1] = -1.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[10].m_data = local_48;
  *(undefined8 *)(pVVar1[10].m_data + 2) = uStack_40;
  local_38[0] = 3.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = local_38[lVar2] * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[0xb].m_data = local_48;
  *(undefined8 *)(pVVar1[0xb].m_data + 2) = uStack_40;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData,
             (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices);
  if (0 < (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices) {
    lVar2 = 0xc;
    uVar3 = 0;
    do {
      uVar4 = 0x3f800000;
      if ((uVar3 & 1) != 0) {
        uVar4 = 0;
      }
      pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -0xc) = 0x3f800000;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -8) = uVar4;
      *(undefined4 *)((long)pVVar1->m_data + lVar2 + -4) = uVar4;
      *(undefined4 *)((long)pVVar1->m_data + lVar2) = 0x3f800000;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while ((long)uVar3 < (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices)
    ;
  }
  return;
}

Assistant:

void GeometryInputTestInstance::genVertexAttribData (void)
{
	// Create 1 X 2 grid in triangle strip adjacent - order
	const float	scale	= 0.3f;
	const Vec4	offset	(-0.5f, -0.2f, 0.0f, 1.0f);
	m_numDrawVertices	= 12;

	m_vertexPosData.resize(m_numDrawVertices);
	m_vertexPosData[ 0] = Vec4( 0,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 1] = Vec4(-1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 2] = Vec4( 0, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 3] = Vec4( 1,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 4] = Vec4( 1,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 5] = Vec4( 0, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 6] = Vec4( 1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 7] = Vec4( 2,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 8] = Vec4( 2,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 9] = Vec4( 1, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[10] = Vec4( 2, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[11] = Vec4( 3,  0, 0.0f, 0.0f) * scale + offset;

	// Red and white
	m_vertexAttrData.resize(m_numDrawVertices);
	for (int i = 0; i < m_numDrawVertices; ++i)
		m_vertexAttrData[i] = (i % 2 == 0) ? Vec4(1, 1, 1, 1) : Vec4(1, 0, 0, 1);
}